

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall Listener::do_accept(Listener *this)

{
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> local_58;
  bind_front_wrapper<void_(Listener::*)(boost::system::error_code,_boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>),_std::shared_ptr<Listener>_>
  local_38;
  
  boost::asio::make_strand<boost::asio::io_context>(&local_58,this->ioc,(type *)0x0);
  std::__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Listener,void>
            ((__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<Listener,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_38.h_ = (offset_in_Listener_to_subr)on_accept;
  local_38._8_8_ = 0;
  local_38.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<Listener>_>.
  super_tuple_element_impl<0UL,_std::shared_ptr<Listener>_>.t.
  super___shared_ptr<Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_38.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<Listener>_>.
  super_tuple_element_impl<0UL,_std::shared_ptr<Listener>_>.t.
  super___shared_ptr<Listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_60._M_pi;
  local_68 = (element_type *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::
  async_accept<boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_boost::beast::detail::bind_front_wrapper<void_(Listener::*)(boost::system::error_code,_boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>),_std::shared_ptr<Listener>_>_>
            (&this->acceptor,&local_58,&local_38,(type *)0x0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_38.args_.
                     super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<Listener>_>
                     .super_tuple_element_impl<0UL,_std::shared_ptr<Listener>_>.t.
                     super___shared_ptr<Listener,_(__gnu_cxx::_Lock_policy)2> + 8));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.impl_.
              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void do_accept()
    {
        // The new connection gets its own strand
        acceptor.async_accept(net::make_strand(ioc),
                              beast::bind_front_handler(&Listener::on_accept, shared_from_this()));
    }